

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseExpression(ParseContext *ctx)

{
  Lexeme *pos;
  SynBase *pSVar1;
  
  pSVar1 = ParseStatement(ctx);
  if (pSVar1 == (SynBase *)0x0) {
    pSVar1 = ParseAssignment(ctx);
    if (pSVar1 == (SynBase *)0x0) {
      pSVar1 = (SynBase *)0x0;
    }
    else {
      pos = ctx->currentLexeme;
      if ((pos->type == lex_none) && (pos != ctx->lastLexeme)) {
        anon_unknown.dwarf_153727::Report(ctx,pos,"ERROR: unknown lexeme");
      }
      anon_unknown.dwarf_153727::CheckConsume
                (ctx,lex_semicolon,"ERROR: \';\' not found after expression");
    }
  }
  return pSVar1;
}

Assistant:

SynBase* ParseExpression(ParseContext &ctx)
{
	if(SynBase *node = ParseStatement(ctx))
		return node;

	if(SynBase *node = ParseAssignment(ctx))
	{
		if(ctx.Peek() == lex_none && ctx.Current() != ctx.Last())
			Report(ctx, ctx.Current(), "ERROR: unknown lexeme");

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after expression");

		return node;
	}

	return NULL;
}